

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

char * __thiscall
fmt::v7::detail::format_uint<4u,char,unsigned__int128>
          (detail *this,char *buffer,unsigned___int128 value,int num_digits,bool upper)

{
  ulong uVar1;
  undefined7 in_register_00000009;
  char *pcVar2;
  undefined4 in_register_00000014;
  ulong uVar3;
  detail *pdVar4;
  int in_R8D;
  long lVar5;
  bool bVar6;
  bool bVar7;
  
  uVar3 = CONCAT44(in_register_00000014,num_digits);
  lVar5 = (long)(int)CONCAT71(in_register_00000009,upper);
  pcVar2 = "0123456789abcdef";
  pdVar4 = this + lVar5 + -1;
  if (in_R8D != 0) {
    pcVar2 = "0123456789ABCDEF";
  }
  do {
    *pdVar4 = *(detail *)(pcVar2 + ((uint)buffer & 0xf));
    pdVar4 = pdVar4 + -1;
    bVar6 = (char *)0xf < buffer;
    bVar7 = uVar3 != 0;
    uVar1 = -uVar3;
    buffer = (char *)(uVar3 << 0x3c | (ulong)buffer >> 4);
    uVar3 = uVar3 >> 4;
  } while (bVar7 || uVar1 < bVar6);
  return (char *)(this + lVar5);
}

Assistant:

inline Char* format_uint(Char* buffer, UInt value, int num_digits,
                         bool upper = false) {
  buffer += num_digits;
  Char* end = buffer;
  do {
    const char* digits = upper ? "0123456789ABCDEF" : data::hex_digits;
    unsigned digit = (value & ((1 << BASE_BITS) - 1));
    *--buffer = static_cast<Char>(BASE_BITS < 4 ? static_cast<char>('0' + digit)
                                                : digits[digit]);
  } while ((value >>= BASE_BITS) != 0);
  return end;
}